

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangle.cpp
# Opt level: O0

Vector3d * __thiscall OpenMD::Triangle::computeCentroid(Triangle *this)

{
  Vector<double,_3U> *in_RSI;
  Vector<double,_3U> *in_RDI;
  Vector3<double> *in_stack_ffffffffffffff88;
  Vector<double,_3U> *v1;
  
  *(undefined1 *)((long)in_RSI[0xc].data_ + 3) = 1;
  v1 = in_RDI;
  OpenMD::operator+(in_RDI,in_RSI);
  OpenMD::operator+(v1,in_RSI);
  operator/(v1,(double)in_RSI);
  Vector3<double>::operator=((Vector3<double> *)v1,in_RSI);
  Vector3<double>::Vector3((Vector3<double> *)in_RSI,in_stack_ffffffffffffff88);
  return (Vector3d *)in_RDI;
}

Assistant:

Vector3d Triangle::computeCentroid() {
  HaveCentroid_ = true;
  centroid_     = (vertices_[0] + vertices_[1] + vertices_[2]) / RealType(3.0);
  return centroid_;
}